

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testGroupEnded(ConsoleReporter *this,TestGroupStats *_testGroupStats)

{
  ostream *poVar1;
  ConsoleReporter *in_RSI;
  TestGroupStats *in_RDI;
  Totals *in_stack_00000558;
  ConsoleReporter *in_stack_00000560;
  
  if ((in_RDI[1].groupInfo.field_0x10 & 1) != 0) {
    printSummaryDivider(in_RSI);
    poVar1 = std::operator<<(*(ostream **)&(in_RDI->groupInfo).field_0x10,"Summary for group \'");
    poVar1 = std::operator<<(poVar1,(string *)
                                    &(in_RSI->super_StreamingReporterBase).
                                     super_SharedImpl<Catch::IStreamingReporter>.m_rc);
    std::operator<<(poVar1,"\':\n");
    printTotals(in_stack_00000560,in_stack_00000558);
    poVar1 = std::operator<<(*(ostream **)&(in_RDI->groupInfo).field_0x10,"\n");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  StreamingReporterBase::testGroupEnded(&in_RSI->super_StreamingReporterBase,in_RDI);
  return;
}

Assistant:

virtual void testGroupEnded( TestGroupStats const& _testGroupStats ) {
            if( currentGroupInfo.used ) {
                printSummaryDivider();
                stream << "Summary for group '" << _testGroupStats.groupInfo.name << "':\n";
                printTotals( _testGroupStats.totals );
                stream << "\n" << std::endl;
            }
            StreamingReporterBase::testGroupEnded( _testGroupStats );
        }